

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Value * parse_value(char **string,size_t nesting)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  JSON_Status JVar7;
  ushort **ppuVar8;
  int *piVar9;
  char *pcVar10;
  JSON_Value *pJVar11;
  byte *pbVar12;
  char *pcVar13;
  JSON_Value *value;
  byte bVar14;
  ushort *puVar15;
  ulong uVar16;
  size_t new_capacity;
  byte *pbVar17;
  JSON_Array *array;
  char *local_40;
  JSON_Object *local_38;
  
  if (0x800 < nesting) {
    return (JSON_Value *)0x0;
  }
  ppuVar8 = __ctype_b_loc();
  pbVar17 = (byte *)*string;
  bVar1 = *pbVar17;
  bVar14 = *(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1);
  while ((bVar14 & 0x20) != 0) {
    pbVar17 = pbVar17 + 1;
    *string = (char *)pbVar17;
    bVar1 = *pbVar17;
    bVar14 = *(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1);
  }
  uVar4 = (uint)bVar1;
  if (uVar4 != 0x5a && 0x59 < bVar1) {
    if (bVar1 < 0x6e) {
      if (uVar4 == 0x5b) {
        pJVar11 = json_value_init_array();
        if (pJVar11 == (JSON_Value *)0x0) {
          return (JSON_Value *)0x0;
        }
        if (**string == '[') {
          if (pJVar11->type == 5) {
            array = (pJVar11->value).array;
          }
          else {
            array = (JSON_Array *)0x0;
          }
          pbVar17 = (byte *)(*string + 1);
          do {
            *string = (char *)pbVar17;
            bVar1 = *pbVar17;
            pbVar17 = pbVar17 + 1;
          } while ((*(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
          if (bVar1 != 0) {
            if (bVar1 == 0x5d) goto LAB_001742d9;
            do {
              value = parse_value(string,nesting + 1);
              if (value == (JSON_Value *)0x0) goto LAB_00174440;
              JVar7 = json_array_add(array,value);
              if (JVar7 != 0) goto LAB_00174421;
              puVar15 = *ppuVar8;
              pbVar17 = (byte *)*string;
              uVar16 = (ulong)*pbVar17;
              bVar1 = *(byte *)((long)puVar15 + uVar16 * 2 + 1);
              while ((bVar1 & 0x20) != 0) {
                pbVar17 = pbVar17 + 1;
                *string = (char *)pbVar17;
                puVar15 = *ppuVar8;
                uVar16 = (ulong)*pbVar17;
                bVar1 = *(byte *)((long)puVar15 + uVar16 * 2 + 1);
              }
              if ((char)uVar16 != ',') goto LAB_001743e5;
              do {
                pbVar17 = pbVar17 + 1;
                *string = (char *)pbVar17;
                puVar15 = *ppuVar8;
              } while ((*(byte *)((long)puVar15 + (ulong)*pbVar17 * 2 + 1) & 0x20) != 0);
            } while (*pbVar17 != 0);
            uVar16 = 0;
LAB_001743e5:
            bVar14 = (byte)uVar16;
            bVar1 = *(byte *)((long)puVar15 + uVar16 * 2 + 1);
            while ((bVar1 & 0x20) != 0) {
              pbVar17 = pbVar17 + 1;
              *string = (char *)pbVar17;
              bVar14 = *pbVar17;
              bVar1 = *(byte *)((long)*ppuVar8 + (ulong)bVar14 * 2 + 1);
            }
            if (bVar14 == 0x5d) {
              if (array == (JSON_Array *)0x0) {
                new_capacity = 0;
              }
              else {
                new_capacity = array->count;
              }
              JVar7 = json_array_resize(array,new_capacity);
              if (JVar7 == 0) {
                *string = *string + 1;
                return pJVar11;
              }
            }
          }
        }
        goto LAB_00174440;
      }
      if (uVar4 != 0x66) {
        return (JSON_Value *)0x0;
      }
    }
    else {
      if (uVar4 == 0x6e) {
        iVar5 = strncmp("null",(char *)pbVar17,4);
        if (iVar5 != 0) {
          return (JSON_Value *)0x0;
        }
        *string = (char *)(pbVar17 + 4);
        pJVar11 = (JSON_Value *)(*parson_malloc)(0x20);
        if (pJVar11 == (JSON_Value *)0x0) {
          return (JSON_Value *)0x0;
        }
        pJVar11->parent = (JSON_Value *)0x0;
        pJVar11->type = 1;
        return pJVar11;
      }
      if (uVar4 != 0x74) {
        if (uVar4 != 0x7b) {
          return (JSON_Value *)0x0;
        }
        pJVar11 = json_value_init_object();
        if (pJVar11 == (JSON_Value *)0x0) {
          return (JSON_Value *)0x0;
        }
        if (**string != '{') {
LAB_00174440:
          json_value_free(pJVar11);
          return (JSON_Value *)0x0;
        }
        if (pJVar11->type == 4) {
          local_38 = (JSON_Object *)(pJVar11->value).string.chars;
        }
        else {
          local_38 = (JSON_Object *)0x0;
        }
        pbVar17 = (byte *)(*string + 1);
        do {
          pbVar12 = pbVar17;
          *string = (char *)pbVar12;
          puVar15 = *ppuVar8;
          bVar1 = *pbVar12;
          uVar16 = (ulong)bVar1;
          pbVar17 = pbVar12 + 1;
        } while ((*(byte *)((long)puVar15 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        if (bVar1 != 0x7d) {
          if (bVar1 != 0) {
            do {
              local_40 = (char *)0x0;
              pcVar10 = get_quoted_string(string,(size_t *)&local_40);
              pcVar3 = local_40;
              if (pcVar10 == (char *)0x0) goto LAB_00174440;
              pcVar13 = (char *)strlen(pcVar10);
              if (pcVar3 != pcVar13) {
LAB_001743d0:
                (*parson_free)(pcVar10);
                goto LAB_00174440;
              }
              pbVar17 = (byte *)*string;
              bVar1 = *pbVar17;
              bVar14 = *(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1);
              while ((bVar14 & 0x20) != 0) {
                pbVar17 = pbVar17 + 1;
                *string = (char *)pbVar17;
                bVar1 = *pbVar17;
                bVar14 = *(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1);
              }
              if (bVar1 != 0x3a) goto LAB_001743d0;
              *string = (char *)(pbVar17 + 1);
              value = parse_value(string,nesting + 1);
              if (value == (JSON_Value *)0x0) goto LAB_001743d0;
              JVar7 = json_object_add(local_38,pcVar10,value);
              if (JVar7 != 0) {
                (*parson_free)(pcVar10);
LAB_00174421:
                json_value_free(value);
                goto LAB_00174440;
              }
              puVar15 = *ppuVar8;
              pbVar12 = (byte *)*string;
              uVar16 = (ulong)*pbVar12;
              bVar1 = *(byte *)((long)puVar15 + uVar16 * 2 + 1);
              while ((bVar1 & 0x20) != 0) {
                pbVar12 = pbVar12 + 1;
                *string = (char *)pbVar12;
                puVar15 = *ppuVar8;
                uVar16 = (ulong)*pbVar12;
                bVar1 = *(byte *)((long)puVar15 + uVar16 * 2 + 1);
              }
              if ((char)uVar16 != ',') goto LAB_001742aa;
              do {
                pbVar12 = pbVar12 + 1;
                *string = (char *)pbVar12;
                puVar15 = *ppuVar8;
              } while ((*(byte *)((long)puVar15 + (ulong)*pbVar12 * 2 + 1) & 0x20) != 0);
            } while (*pbVar12 != 0);
            uVar16 = 0;
          }
LAB_001742aa:
          bVar14 = (byte)uVar16;
          bVar1 = *(byte *)((long)puVar15 + uVar16 * 2 + 1);
          while ((bVar1 & 0x20) != 0) {
            pbVar12 = pbVar12 + 1;
            *string = (char *)pbVar12;
            bVar14 = *pbVar12;
            bVar1 = *(byte *)((long)*ppuVar8 + (ulong)bVar14 * 2 + 1);
          }
          if (bVar14 != 0x7d) goto LAB_00174440;
          pbVar17 = pbVar12 + 1;
        }
LAB_001742d9:
        *string = (char *)pbVar17;
        return pJVar11;
      }
    }
    iVar5 = strncmp("true",(char *)pbVar17,4);
    if (iVar5 == 0) {
      *string = (char *)(pbVar17 + 4);
      pJVar11 = (JSON_Value *)(*parson_malloc)(0x20);
      if (pJVar11 == (JSON_Value *)0x0) {
        return (JSON_Value *)0x0;
      }
      iVar5 = 1;
    }
    else {
      iVar6 = strncmp("false",(char *)pbVar17,5);
      iVar5 = 0;
      if (iVar6 != 0) {
        return (JSON_Value *)0x0;
      }
      *string = (char *)(pbVar17 + 5);
      pJVar11 = (JSON_Value *)(*parson_malloc)(0x20);
      if (pJVar11 == (JSON_Value *)0x0) {
        return (JSON_Value *)0x0;
      }
    }
    pJVar11->parent = (JSON_Value *)0x0;
    pJVar11->type = 6;
    (pJVar11->value).boolean = iVar5;
    return pJVar11;
  }
  if (9 < uVar4 - 0x30) {
    if (uVar4 == 0x22) {
      local_40 = (char *)0x0;
      pcVar10 = get_quoted_string(string,(size_t *)&local_40);
      pcVar3 = local_40;
      if (pcVar10 == (char *)0x0) {
        return (JSON_Value *)0x0;
      }
      pJVar11 = (JSON_Value *)(*parson_malloc)(0x20);
      if (pJVar11 == (JSON_Value *)0x0) {
        (*parson_free)(pcVar10);
        return (JSON_Value *)0x0;
      }
      pJVar11->parent = (JSON_Value *)0x0;
      pJVar11->type = 2;
      (pJVar11->value).string.chars = pcVar10;
      (pJVar11->value).string.length = (size_t)pcVar3;
      return pJVar11;
    }
    if (uVar4 != 0x2d) {
      return (JSON_Value *)0x0;
    }
  }
  piVar9 = __errno_location();
  *piVar9 = 0;
  local_38 = (JSON_Object *)strtod((char *)pbVar17,&local_40);
  iVar5 = *piVar9;
  if ((iVar5 == 0x22) && (ABS((double)local_38) == INFINITY)) {
    return (JSON_Value *)0x0;
  }
  if ((iVar5 != 0x22) && (iVar5 != 0)) {
    return (JSON_Value *)0x0;
  }
  pcVar3 = *string;
  uVar16 = (long)local_40 - (long)pcVar3;
  if (1 < uVar16) {
    if (*pcVar3 == '0') {
      cVar2 = pcVar3[1];
    }
    else {
      if ((*pcVar3 != '-' || uVar16 == 2) || (pcVar3[1] != '0')) goto LAB_00174105;
      cVar2 = pcVar3[2];
    }
    if (cVar2 != '.') {
      return (JSON_Value *)0x0;
    }
  }
LAB_00174105:
  while( true ) {
    if (uVar16 == 0) {
      *string = local_40;
      if (((ulong)ABS((double)local_38) < 0x7ff0000000000000) &&
         (pJVar11 = (JSON_Value *)(*parson_malloc)(0x20), pJVar11 != (JSON_Value *)0x0)) {
        pJVar11->parent = (JSON_Value *)0x0;
        pJVar11->type = 3;
        (pJVar11->value).number = (double)local_38;
        return pJVar11;
      }
      return (JSON_Value *)0x0;
    }
    cVar2 = pcVar3[uVar16 - 1];
    if (cVar2 == '\0') {
      return (JSON_Value *)0x0;
    }
    if (cVar2 == 'X') break;
    uVar16 = uVar16 - 1;
    if (cVar2 == 'x') {
      return (JSON_Value *)0x0;
    }
  }
  return (JSON_Value *)0x0;
}

Assistant:

static JSON_Value * parse_value(const char **string, size_t nesting) {
    if (nesting > MAX_NESTING) {
        return NULL;
    }
    SKIP_WHITESPACES(string);
    switch (**string) {
        case '{':
            return parse_object_value(string, nesting + 1);
        case '[':
            return parse_array_value(string, nesting + 1);
        case '\"':
            return parse_string_value(string);
        case 'f': case 't':
            return parse_boolean_value(string);
        case '-':
        case '0': case '1': case '2': case '3': case '4':
        case '5': case '6': case '7': case '8': case '9':
            return parse_number_value(string);
        case 'n':
            return parse_null_value(string);
        default:
            return NULL;
    }
}